

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

DecodeStatus DecodeL6RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Op3_00;
  uint Op6;
  uint Op5;
  uint Op4;
  uint Op3;
  uint Op2;
  uint Op1;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  DVar1 = Decode3OpInstruction(Insn & 0xffff,&local_1c,&local_20,&local_24);
  if (DVar1 == MCDisassembler_Success) {
    Op3_00 = &local_30;
    DVar1 = Decode3OpInstruction(Insn >> 0x10,&local_28,&local_2c,Op3_00);
    if (DVar1 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass(Inst,local_1c,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_28,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_20,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_24,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_2c,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_30,Address,Op3_00);
      DVar1 = MCDisassembler_Success;
    }
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL6RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5, Op6;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return S;

	S = Decode3OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5, &Op6);
	if (S != MCDisassembler_Success)
		return S;

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op6, Address, Decoder);
	return S;
}